

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# depfile_shared.h
# Opt level: O1

QString * escapeDependencyPath<QString>(QString *__return_storage_ptr__,QString *path)

{
  ArrayOptions *pAVar1;
  char16_t cVar2;
  Data *pDVar3;
  long lVar4;
  long lVar5;
  QChar QVar6;
  ulong uVar7;
  uint uVar8;
  
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
  (__return_storage_ptr__->d).size = 0;
  uVar8 = (uint)(path->d).size;
  lVar5 = (long)(int)uVar8;
  pDVar3 = (__return_storage_ptr__->d).d;
  if (((pDVar3 == (Data *)0x0) ||
      (1 < (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) ||
     ((pDVar3->super_QArrayData).alloc -
      ((long)((long)(__return_storage_ptr__->d).ptr -
             ((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 1) <=
      lVar5)) {
    lVar4 = (__return_storage_ptr__->d).size;
    if (lVar5 < lVar4) {
      lVar5 = lVar4;
    }
    QString::reallocData((longlong)__return_storage_ptr__,(AllocationOption)lVar5);
  }
  pDVar3 = (__return_storage_ptr__->d).d;
  if ((pDVar3 != (Data *)0x0) && ((pDVar3->super_QArrayData).alloc != 0)) {
    pAVar1 = &(pDVar3->super_QArrayData).flags;
    *(byte *)&(pAVar1->super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
              super_QFlagsStorage<QArrayData::ArrayOption>.i =
         (byte)(pAVar1->super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
               super_QFlagsStorage<QArrayData::ArrayOption>.i | 1;
  }
  if (0 < (int)uVar8) {
    lVar5 = 1;
    uVar7 = 0;
    do {
      cVar2 = (path->d).ptr[uVar7];
      QVar6.ucs = (char16_t)__return_storage_ptr__;
      if (cVar2 == L' ') {
        QString::append(QVar6);
        lVar4 = lVar5;
        if (1 < uVar7) {
          do {
            if ((path->d).ptr[(int)lVar4 - 2] != L'\\') break;
            QString::append(QVar6);
            lVar4 = lVar4 + -1;
          } while (2 < lVar4);
        }
      }
      else if ((cVar2 == L'$') || (cVar2 == L'#')) {
        QString::append(QVar6);
      }
      QString::append(QVar6);
      uVar7 = uVar7 + 1;
      lVar5 = lVar5 + 1;
    } while (uVar7 != (uVar8 & 0x7fffffff));
  }
  return __return_storage_ptr__;
}

Assistant:

StringType escapeDependencyPath(const StringType &path)
{
    using CT = typename CharType<StringType>::type;
    StringType escapedPath;
    int size = path.size();
    escapedPath.reserve(size);
    for (int i = 0; i < size; ++i) {
        if (path[i] == CT('$')) {
            escapedPath.append(CT('$'));
        } else if (path[i] == CT('#')) {
            escapedPath.append(CT('\\'));
        } else if (path[i] == CT(' ')) {
            escapedPath.append(CT('\\'));
            int backwards_it = i - 1;
            while (backwards_it > 0 && path[backwards_it] == CT('\\')) {
                escapedPath.append(CT('\\'));
                --backwards_it;
            }
        }
        escapedPath.append(path[i]);
    }
    return escapedPath;
}